

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setAuthority(QUrl *this,QString *authority,ParsingMode mode)

{
  int in_EDX;
  QString *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_00000030;
  QUrlPrivate *in_stack_00000038;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  QMessageLogger local_28;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QUrl *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0));
  QUrlPrivate::clearError((QUrlPrivate *)0x2fb320);
  if (in_EDX == 2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(2,in_stack_ffffffffffffffc0),in_RDI,line,
               in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (&local_28,"QUrl::setAuthority(): QUrl::DecodedMode is not permitted in this function"
              );
  }
  else {
    QString::size(in_RSI);
    QUrlPrivate::setAuthority
              (in_stack_00000038,in_stack_00000030,(qsizetype)this,(qsizetype)authority,mode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setAuthority(const QString &authority, ParsingMode mode)
{
    detach();
    d->clearError();

    if (mode == DecodedMode) {
        qWarning("QUrl::setAuthority(): QUrl::DecodedMode is not permitted in this function");
        return;
    }

    d->setAuthority(authority, 0, authority.size(), mode);
}